

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0
          (CrossingProcessor *this,ShapeEdgeId a_id,Edge *a,CrossingIterator *it)

{
  bool bVar1;
  PointCrossingResult PVar2;
  bool bVar3;
  bool bVar4;
  S2LogMessage local_30;
  
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)a,&a->v1);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x52d,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: (a.v0) == (a.v1) ");
    abort();
  }
  if (this->invert_a_ == this->invert_result_) {
    PVar2 = ProcessPointCrossings(this,a_id,&a->v0,it);
    bVar1 = this->invert_b_;
    bVar4 = this->inside_ != bVar1;
    bVar3 = this->polygon_model_ == CLOSED;
    if (this->polygon_model_ == SEMI_OPEN) {
      bVar3 = bVar4;
    }
    if (((uint3)PVar2 >> 0x10 & 1) == 0) {
      bVar3 = bVar4;
    }
    bVar3 = (bool)(PVar2.matches_polyline & 1U | bVar3);
    bVar4 = true;
    if ((this->is_union_ & 1U) != 0) {
      bVar4 = bVar3;
    }
    if (((uint3)PVar2 & 1) == 0) {
      bVar4 = bVar3;
    }
    if (bVar4 != bVar1) {
      bVar1 = AddPointEdge(this,&a->v0,0);
      return bVar1;
    }
  }
  else {
    SkipCrossings(this,a_id,it);
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0(
    ShapeEdgeId a_id, const S2Shape::Edge& a, CrossingIterator* it) {
  S2_DCHECK_EQ(a.v0, a.v1);
  // When a region is inverted, all points and polylines are discarded.
  if (invert_a_ != invert_result_) {
    SkipCrossings(a_id, it);
    return true;
  }
  PointCrossingResult r = ProcessPointCrossings(a_id, a.v0, it);

  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region, using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;
  if (r.matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  if (r.matches_polyline) contained = true;

  // The output of UNION includes duplicate values, so ensure that points are
  // not suppressed by other points.
  if (r.matches_point && !is_union_) contained = true;

  // Test whether the point is contained after region B is inverted.
  if (contained == invert_b_) return true;  // Don't exit early.
  return AddPointEdge(a.v0, 0);
}